

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::setNamedItem(QDomNamedNodeMapPrivate *this,QDomNodePrivate *arg)

{
  long lVar1;
  QString *key;
  QMultiHash<QString,_QDomNodePrivate_*> *this_00;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *n;
  QDomNodePrivate *in_stack_ffffffffffffff68;
  QMultiHash<QString,_QDomNodePrivate_*> *in_stack_ffffffffffffff78;
  QDomNodePrivate *key_00;
  undefined8 local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)(in_RDI + 0x20) & 1) == 0) && (in_RSI != 0)) {
    if ((*(byte *)(in_RDI + 0x21) & 1) == 0) {
      key = (QString *)(in_RDI + 8);
      QDomNodePrivate::nodeName(in_stack_ffffffffffffff68);
      local_60 = QMultiHash<QString,_QDomNodePrivate_*>::value(in_stack_ffffffffffffff78,key);
      QString::~QString((QString *)0x11251c);
      key_00 = local_60;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x112537);
      this_00 = (QMultiHash<QString,_QDomNodePrivate_*> *)(in_RDI + 8);
      QDomNodePrivate::nodeName(in_stack_ffffffffffffff68);
      QMultiHash<QString,_QDomNodePrivate_*>::insert
                (this_00,(QString *)key_00,(QDomNodePrivate **)key);
      QString::~QString((QString *)0x11257d);
    }
    else {
      local_60 = (QDomNodePrivate *)
                 (**(code **)(**(long **)(in_RDI + 0x18) + 0x38))(*(long **)(in_RDI + 0x18),in_RSI);
    }
  }
  else {
    local_60 = (QDomNodePrivate *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_60;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::setNamedItem(QDomNodePrivate* arg)
{
    if (readonly || !arg)
        return nullptr;

    if (appendToParent)
        return parent->appendChild(arg);

    QDomNodePrivate *n = map.value(arg->nodeName());
    // We take a reference
    arg->ref.ref();
    map.insert(arg->nodeName(), arg);
    return n;
}